

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O3

FFSFormatList AddUniqueFormats(FFSFormatList List,FFSFormatList Candidates,int copy)

{
  size_t sVar1;
  FFSFormatList pFVar2;
  int iVar3;
  char *pcVar4;
  FFSFormatList pFVar5;
  FFSFormatBlock *pFVar6;
  int iVar7;
  FFSFormatList pFVar8;
  
  pFVar5 = List;
  if (Candidates != (FFSFormatList)0x0) {
    do {
      if (pFVar5 == (FFSFormatList)0x0) {
        pFVar6 = Candidates->Next;
        pFVar8 = (FFSFormatList)0x0;
LAB_00111eeb:
        if (copy == 0) {
          Candidates->Next = (FFSFormatBlock *)0x0;
          List = Candidates;
        }
        else {
          List = (FFSFormatList)calloc(1,0x28);
          sVar1 = Candidates->FormatServerRepLen;
          pcVar4 = (char *)malloc(sVar1);
          List->FormatServerRep = pcVar4;
          memcpy(pcVar4,Candidates->FormatServerRep,sVar1);
          List->FormatServerRepLen = Candidates->FormatServerRepLen;
          sVar1 = Candidates->FormatIDRepLen;
          pcVar4 = (char *)malloc(sVar1);
          List->FormatIDRep = pcVar4;
          memcpy(pcVar4,Candidates->FormatIDRep,sVar1);
          List->FormatIDRepLen = Candidates->FormatIDRepLen;
        }
        if (pFVar8 != (FFSFormatList)0x0) {
          pFVar8->Next = List;
          List = pFVar5;
        }
      }
      else {
        sVar1 = Candidates->FormatIDRepLen;
        iVar7 = 0;
        pFVar2 = pFVar5;
        do {
          pFVar8 = pFVar2;
          if (pFVar8->FormatIDRepLen == sVar1) {
            iVar3 = bcmp(pFVar8->FormatIDRep,Candidates->FormatIDRep,sVar1);
            iVar7 = iVar7 + (uint)(iVar3 == 0);
          }
          pFVar2 = pFVar8->Next;
        } while (pFVar8->Next != (FFSFormatBlock *)0x0);
        pFVar6 = Candidates->Next;
        List = pFVar5;
        if (iVar7 == 0) goto LAB_00111eeb;
      }
      pFVar5 = List;
      Candidates = pFVar6;
    } while (pFVar6 != (FFSFormatBlock *)0x0);
  }
  return List;
}

Assistant:

static FFSFormatList AddUniqueFormats(FFSFormatList List, FFSFormatList Candidates, int copy)
{
    while (Candidates)
    {
        FFSFormatList Last = NULL;
        FFSFormatList Tmp = List;
        int Found = 0;
        FFSFormatList ThisCandidate = Candidates;
        while (Tmp)
        {
            if ((Tmp->FormatIDRepLen == ThisCandidate->FormatIDRepLen) &&
                (memcmp(Tmp->FormatIDRep, ThisCandidate->FormatIDRep, Tmp->FormatIDRepLen) == 0))
            {
                // Identical format already in List, don't add this one
                Found++;
            }
            Last = Tmp;
            Tmp = Tmp->Next;
        }
        Candidates = Candidates->Next;
        if (!Found)
        {
            // New format not in list, add him to tail.
            if (copy)
            {
                // Copy top Candidates entry before return
                FFSFormatList Tmp = malloc(sizeof(*Tmp));
                memset(Tmp, 0, sizeof(*Tmp));
                Tmp->FormatServerRep = malloc(ThisCandidate->FormatServerRepLen);
                memcpy(Tmp->FormatServerRep, ThisCandidate->FormatServerRep,
                       ThisCandidate->FormatServerRepLen);
                Tmp->FormatServerRepLen = ThisCandidate->FormatServerRepLen;
                Tmp->FormatIDRep = malloc(ThisCandidate->FormatIDRepLen);
                memcpy(Tmp->FormatIDRep, ThisCandidate->FormatIDRep, ThisCandidate->FormatIDRepLen);
                Tmp->FormatIDRepLen = ThisCandidate->FormatIDRepLen;
                ThisCandidate = Tmp;
            }
            else
            {
                // disconnect this guy so that he can become list end
                ThisCandidate->Next = NULL;
            }
            if (Last)
            {
                Last->Next = ThisCandidate;
            }
            else
            {
                List = ThisCandidate;
            }
        }
    }
    return List;
}